

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_slb.c
# Opt level: O0

int slbLoadEntries(PHYSFS_Io *io,PHYSFS_uint32 count,void *arc)

{
  int iVar1;
  void *pvVar2;
  char *local_88;
  char *ptr;
  char local_78 [7];
  char backslash;
  char name [64];
  PHYSFS_uint32 local_30;
  PHYSFS_uint32 size;
  PHYSFS_uint32 pos;
  PHYSFS_uint32 i;
  void *arc_local;
  PHYSFS_Io *pPStack_18;
  PHYSFS_uint32 count_local;
  PHYSFS_Io *io_local;
  
  size = 0;
  _pos = arc;
  arc_local._4_4_ = count;
  pPStack_18 = io;
  while( true ) {
    if (arc_local._4_4_ <= size) {
      return 1;
    }
    iVar1 = __PHYSFS_readAll(pPStack_18,(void *)((long)&ptr + 7),1);
    if (iVar1 == 0) {
      return 0;
    }
    if (ptr._7_1_ != '\\') {
      PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
      return 0;
    }
    iVar1 = __PHYSFS_readAll(pPStack_18,local_78,0x3f);
    if (iVar1 == 0) break;
    name[0x37] = '\0';
    for (local_88 = local_78; *local_88 != '\0'; local_88 = local_88 + 1) {
      if (*local_88 == '\\') {
        *local_88 = '/';
      }
    }
    iVar1 = __PHYSFS_readAll(pPStack_18,&local_30,4);
    if (iVar1 == 0) {
      return 0;
    }
    local_30 = PHYSFS_swapULE32(local_30);
    iVar1 = __PHYSFS_readAll(pPStack_18,name + 0x3c,4);
    if (iVar1 == 0) {
      return 0;
    }
    name._60_4_ = PHYSFS_swapULE32(name._60_4_);
    pvVar2 = UNPK_addEntry(_pos,local_78,0,-1,-1,(ulong)local_30,(ulong)(uint)name._60_4_);
    if (pvVar2 == (void *)0x0) {
      return 0;
    }
    size = size + 1;
  }
  return 0;
}

Assistant:

static int slbLoadEntries(PHYSFS_Io *io, const PHYSFS_uint32 count, void *arc)
{
    PHYSFS_uint32 i;
    for (i = 0; i < count; i++)
    {
        PHYSFS_uint32 pos;
        PHYSFS_uint32 size;
        char name[64];
        char backslash;
        char *ptr;

        /* don't include the '\' in the beginning */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &backslash, 1), 0);
        BAIL_IF(backslash != '\\', PHYSFS_ERR_CORRUPT, 0);

        /* read the rest of the buffer, 63 bytes */
        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &name, 63), 0);
        name[63] = '\0'; /* in case the name lacks the null terminator */

        /* convert backslashes */
        for (ptr = name; *ptr; ptr++)
        {
            if (*ptr == '\\')
                *ptr = '/';
        } /* for */

        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &pos, 4), 0);
        pos = PHYSFS_swapULE32(pos);

        BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &size, 4), 0);
        size = PHYSFS_swapULE32(size);

        BAIL_IF_ERRPASS(!UNPK_addEntry(arc, name, 0, -1, -1, pos, size), 0);
    } /* for */

    return 1;
}